

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

size_t __thiscall V2Transport::GetSendMemoryUsage(V2Transport *this)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock55;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock55,&this->m_send_mutex,"m_send_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x608,false);
  if (this->m_send_state == V1) {
    sVar4 = V1Transport::GetSendMemoryUsage(&this->m_v1_fallback);
  }
  else {
    puVar2 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar3 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar4 = 0x18;
    if (puVar2 != puVar3) {
      sVar4 = ((ulong)(puVar2 + (0x1f - (long)puVar3)) & 0xfffffffffffffff0) + 0x18;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock55.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar4;
  }
  __stack_chk_fail();
}

Assistant:

size_t V2Transport::GetSendMemoryUsage() const noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_send_state == SendState::V1) return m_v1_fallback.GetSendMemoryUsage();

    return sizeof(m_send_buffer) + memusage::DynamicUsage(m_send_buffer);
}